

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::FieldConstantName_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field)

{
  char cVar1;
  long *plVar2;
  long lVar3;
  size_type sVar4;
  pointer pcVar5;
  size_type sVar6;
  
  plVar2 = *(long **)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar3 = *plVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar3,plVar2[1] + lVar3);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  sVar4 = __return_storage_ptr__->_M_string_length;
  if (sVar4 != 0) {
    pcVar5 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar6 = 0;
    do {
      cVar1 = pcVar5[sVar6];
      if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        pcVar5[sVar6] = cVar1 + -0x20;
      }
      sVar6 = sVar6 + 1;
    } while (sVar4 != sVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

string FieldConstantName(const FieldDescriptor *field) {
  string name = field->name() + "_FIELD_NUMBER";
  UpperString(&name);
  return name;
}